

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_Sort_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  int iVar1;
  int iVar2;
  int local_34;
  int local_30;
  int best_i;
  int j;
  int i;
  int temp;
  int nSize;
  int *pOutBeg_local;
  int *pInEnd_local;
  int *pInBeg_local;
  
  iVar2 = (int)((long)pInEnd - (long)pInBeg >> 2);
  if (iVar2 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilSort.c"
                  ,0x53,"void Abc_Sort_rec(int *, int *, int *)");
  }
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      if (pInBeg[1] < *pInBeg) {
        *pInBeg = pInBeg[1] ^ *pInBeg;
        pInBeg[1] = *pInBeg ^ pInBeg[1];
        *pInBeg = pInBeg[1] ^ *pInBeg;
      }
    }
    else if (iVar2 < 8) {
      for (best_i = 0; best_i < iVar2 + -1; best_i = best_i + 1) {
        local_34 = best_i;
        local_30 = best_i;
        while (local_30 = local_30 + 1, local_30 < iVar2) {
          if (pInBeg[local_30] < pInBeg[local_34]) {
            local_34 = local_30;
          }
        }
        iVar1 = pInBeg[best_i];
        pInBeg[best_i] = pInBeg[local_34];
        pInBeg[local_34] = iVar1;
      }
    }
    else {
      Abc_Sort_rec(pInBeg,pInBeg + iVar2 / 2,pOutBeg);
      Abc_Sort_rec(pInBeg + iVar2 / 2,pInEnd,pOutBeg + iVar2 / 2);
      Abc_SortMerge(pInBeg,pInBeg + iVar2 / 2,pInBeg + iVar2 / 2,pInEnd,pOutBeg);
      memcpy(pInBeg,pOutBeg,(long)iVar2 << 2);
    }
  }
  return;
}

Assistant:

void Abc_Sort_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = pInEnd - pInBeg;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[0] > pInBeg[1] )
         {
             pInBeg[0] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[1];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[j] < pInBeg[best_i] )
                    best_i = j;
            temp = pInBeg[i]; 
            pInBeg[i] = pInBeg[best_i]; 
            pInBeg[best_i] = temp;
        }
    }
    else
    {
        Abc_Sort_rec( pInBeg, pInBeg + nSize/2, pOutBeg );
        Abc_Sort_rec( pInBeg + nSize/2, pInEnd, pOutBeg + nSize/2 );
        Abc_SortMerge( pInBeg, pInBeg + nSize/2, pInBeg + nSize/2, pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * nSize );
    }
}